

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O0

void u_setTimeZoneFilesDirectory_63(char *path,UErrorCode *status)

{
  UErrorCode *status_local;
  char *path_local;
  
  icu_63::umtx_initOnce(&gTimeZoneFilesInitOnce_63,TimeZoneDataDirInitFn,status);
  setTimeZoneFilesDir(path,status);
  return;
}

Assistant:

U_CAPI void U_EXPORT2
u_setTimeZoneFilesDirectory(const char *path, UErrorCode *status) {
    umtx_initOnce(gTimeZoneFilesInitOnce, &TimeZoneDataDirInitFn, *status);
    setTimeZoneFilesDir(path, *status);

    // Note: this function does some extra churn, first setting based on the
    //       environment, then immediately replacing with the value passed in.
    //       The logic is simpler that way, and performance shouldn't be an issue.
}